

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  TestCase *pTVar6;
  int width;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  TimeInMillis ms;
  int i;
  long in_FS_OFFSET;
  allocator<char> local_2ed;
  int local_2ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  string kIndent;
  string kTestsuites;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  tm time_struct;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestsuites,"testsuites",(allocator<char> *)&time_struct);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"tests",(allocator<char> *)&local_88);
  iVar3 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar3,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"failures",(allocator<char> *)&local_88);
  iVar3 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar3,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"disabled",(allocator<char> *)&local_88);
  iVar3 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar3,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"errors",(allocator<char> *)&local_88);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,0,&kIndent,true);
  std::__cxx11::string::~string((string *)&time_struct);
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&time_struct,"random_seed",(allocator<char> *)&local_88);
    OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,unit_test->impl_->random_seed_,&kIndent
                  ,true);
    std::__cxx11::string::~string((string *)&time_struct);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"timestamp",&local_2ed);
  bVar2 = PortableLocaltime(unit_test->impl_->start_timestamp_ / 1000,&time_struct);
  if (bVar2) {
    local_2ec = time_struct.tm_year + 0x76c;
    StreamableToString<int>(&local_1c8,&local_2ec);
    std::operator+(&local_1a8,&local_1c8,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1e8,(String *)(ulong)(time_struct.tm_mon + 1),value);
    std::operator+(&local_188,&local_1a8,&local_1e8);
    std::operator+(&local_168,&local_188,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_208,(String *)(ulong)(uint)time_struct.tm_mday,value_00);
    std::operator+(&local_148,&local_168,&local_208);
    std::operator+(&local_128,&local_148,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_228,(String *)(ulong)(uint)time_struct.tm_hour,value_01);
    std::operator+(&local_108,&local_128,&local_228);
    std::operator+(&local_e8,&local_108,":");
    String::FormatIntWidth2_abi_cxx11_
              (&local_248,(String *)(ulong)(uint)time_struct.tm_min,value_02);
    std::operator+(&local_c8,&local_e8,&local_248);
    std::operator+(&local_a8,&local_c8,":");
    String::FormatIntWidth2_abi_cxx11_
              (&local_268,(String *)(ulong)(uint)time_struct.tm_sec,value_03);
    std::operator+(&local_88,&local_a8,&local_268);
    std::operator+(&local_2e8,&local_88,"Z");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"",(allocator<char> *)&local_88);
  }
  OutputJsonKey(stream,&kTestsuites,&local_2c8,&local_2e8,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"time",(allocator<char> *)&local_a8);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_88,(internal *)unit_test->impl_->elapsed_time_,ms);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,&local_88,&kIndent,false);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&time_struct);
  TestPropertiesAsJson((string *)&time_struct,&unit_test->impl_->ad_hoc_test_result_,&kIndent);
  poVar5 = std::operator<<(stream,(string *)&time_struct);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string((string *)&time_struct);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_struct,"name",(allocator<char> *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"AllTests",(allocator<char> *)&local_c8);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,&local_88,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&time_struct);
  poVar5 = std::operator<<(stream,(string *)&kIndent);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)&kTestsuites);
  std::operator<<(poVar5,"\": [\n");
  bVar2 = false;
  for (iVar3 = 0;
      iVar3 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(unit_test->impl_->test_cases_).
                                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar3 = iVar3 + 1
      ) {
    pTVar6 = UnitTest::GetTestCase(unit_test,iVar3);
    iVar4 = TestCase::reportable_test_count(pTVar6);
    if (0 < iVar4) {
      if (bVar2) {
        std::operator<<(stream,",\n");
      }
      pTVar6 = UnitTest::GetTestCase(unit_test,iVar3);
      bVar2 = true;
      PrintJsonTestCase(stream,pTVar6);
    }
  }
  poVar5 = std::operator<<(stream,"\n");
  poVar5 = std::operator<<(poVar5,(string *)&kIndent);
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuites);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}